

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

char * TiXmlBase::SkipWhiteSpace(char *p,TiXmlEncoding encoding)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  
  if ((p == (char *)0x0) || (bVar3 = *p, bVar3 == 0)) {
    p = (char *)0x0;
  }
  else {
    if (encoding == TIXML_ENCODING_UTF8) {
      do {
        uVar2 = (uint)bVar3;
        if (bVar3 == 0xef) {
          if (((byte *)p)[1] != 0xbf) {
            if (((byte *)p)[1] == 0xbb) goto LAB_0010f06a;
            goto LAB_0010f076;
          }
          if (((byte *)p)[2] != 0xbe) {
LAB_0010f06a:
            if (((byte *)p)[2] != 0xbf) goto LAB_0010f076;
          }
          p = (char *)((byte *)p + 3);
        }
        else {
          if (uVar2 == 0) {
            return (char *)(byte *)p;
          }
LAB_0010f076:
          iVar1 = isspace(uVar2);
          p = (char *)((byte *)p + ((bVar3 == 0xd || bVar3 == 10) || iVar1 != 0));
          if (((iVar1 == 0) && (bVar3 != 10)) && (uVar2 != 0xd)) {
            return (char *)(byte *)p;
          }
        }
        bVar3 = *p;
      } while( true );
    }
    do {
      iVar1 = isspace((uint)bVar3);
      if (((iVar1 == 0) && (bVar3 != 0xd)) && (bVar3 != 10)) {
        return p;
      }
      bVar3 = p[1];
      p = p + 1;
    } while (bVar3 != 0);
  }
  return p;
}

Assistant:

const char* TiXmlBase::SkipWhiteSpace( const char* p, TiXmlEncoding encoding )
{
	if ( !p || !*p )
	{
		return 0;
	}
	if ( encoding == TIXML_ENCODING_UTF8 )
	{
		while ( *p )
		{
			const unsigned char* pU = (const unsigned char*)p;
			
			// Skip the stupid Microsoft UTF-8 Byte order marks
			if (	*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==TIXML_UTF_LEAD_1 
				 && *(pU+2)==TIXML_UTF_LEAD_2 )
			{
				p += 3;
				continue;
			}
			else if(*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==0xbfU
				 && *(pU+2)==0xbeU )
			{
				p += 3;
				continue;
			}
			else if(*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==0xbfU
				 && *(pU+2)==0xbfU )
			{
				p += 3;
				continue;
			}

			if ( IsWhiteSpace( *p ) )		// Still using old rules for white space.
				++p;
			else
				break;
		}
	}
	else
	{
		while ( *p && IsWhiteSpace( *p ) )
			++p;
	}

	return p;
}